

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::GenerateObjectFieldStub_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,FieldDef *field,Imports *imports
          )

{
  undefined8 uVar1;
  bool bVar2;
  Import *pIVar3;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  Type local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  string local_1f8;
  undefined1 local_1d8 [8];
  Import import_1;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  Import import;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_51;
  Type *local_50;
  Type *field_type;
  string field_name;
  Imports *imports_local;
  FieldDef *field_local;
  PythonStubGenerator *this_local;
  string *result;
  
  field_name.field_2._8_8_ = imports;
  IdlNamer::Field_abi_cxx11_((string *)&field_type,(IdlNamer *)(this + 8),field);
  local_50 = &(field->value).type;
  bVar2 = IsScalar((((Value *)local_50)->type).base_type);
  uVar1 = field_name.field_2._8_8_;
  if (bVar2) {
    local_51 = 0;
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field_type,
                   ": ");
    TypeOf_abi_cxx11_(&local_a8,this,local_50,(Imports *)field_name.field_2._8_8_);
    std::operator+(__return_storage_ptr__,&local_78,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_78);
    bVar2 = FieldDef::IsOptional(field);
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," | None");
    }
    local_51 = 1;
    import.name.field_2._12_4_ = 1;
  }
  else {
    switch(((Type *)&local_50->base_type)->base_type) {
    case BASE_TYPE_STRING:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &field_type,": str | None");
      import.name.field_2._12_4_ = 1;
      break;
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_ARRAY:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"typing",
                 (allocator<char> *)(import_1.name.field_2._M_local_buf + 0xf));
      Imports::Import((Imports *)uVar1,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator
                ((allocator<char> *)(import_1.name.field_2._M_local_buf + 0xf));
      uVar1 = field_name.field_2._8_8_;
      if (local_50->element == BASE_TYPE_STRUCT) {
        anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::StructDef>
                  (&local_1f8,(PythonStubGenerator *)this,local_50->struct_def);
        IdlNamer::ObjectType_abi_cxx11_(&local_218,(IdlNamer *)(this + 8),local_50->struct_def);
        pIVar3 = Imports::Import((Imports *)uVar1,&local_1f8,&local_218);
        Import::Import((Import *)local_1d8,pIVar3);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::operator+(&local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_type,": typing.List[");
        std::operator+(&local_238,&local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&import_1.module.field_2 + 8));
        std::operator+(__return_storage_ptr__,&local_238,"]");
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        import.name.field_2._12_4_ = 1;
        Import::~Import((Import *)local_1d8);
      }
      else if (local_50->element == BASE_TYPE_STRING) {
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_type,": typing.List[str]");
        import.name.field_2._12_4_ = 1;
      }
      else {
        std::operator+(&local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_type,": typing.List[");
        Type::VectorType(&local_2d8,local_50);
        TypeOf_abi_cxx11_(&local_2b8,this,&local_2d8,(Imports *)field_name.field_2._8_8_);
        std::operator+(&local_278,&local_298,&local_2b8);
        std::operator+(__return_storage_ptr__,&local_278,"]");
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_298);
        import.name.field_2._12_4_ = 1;
      }
      break;
    case BASE_TYPE_STRUCT:
      anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::StructDef>
                (&local_110,(PythonStubGenerator *)this,local_50->struct_def);
      IdlNamer::ObjectType_abi_cxx11_(&local_130,(IdlNamer *)(this + 8),local_50->struct_def);
      pIVar3 = Imports::Import((Imports *)uVar1,&local_110,&local_130);
      Import::Import((Import *)local_f0,pIVar3);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &field_type,": ");
      std::operator+(&local_150,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&import.module.field_2 + 8));
      std::operator+(__return_storage_ptr__,&local_150," | None");
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      import.name.field_2._12_4_ = 1;
      Import::~Import((Import *)local_f0);
      break;
    case BASE_TYPE_UNION:
      std::operator+(&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &field_type,": ");
      UnionObjectType_abi_cxx11_
                (&local_318,this,(field->value).type.enum_def,(Imports *)field_name.field_2._8_8_);
      std::operator+(__return_storage_ptr__,&local_2f8,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f8);
      import.name.field_2._12_4_ = 1;
      break;
    default:
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&field_type);
      import.name.field_2._12_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)&field_type);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateObjectFieldStub(const FieldDef *field,
                                      Imports *imports) const {
    std::string field_name = namer_.Field(*field);

    const Type &field_type = field->value.type;
    if (IsScalar(field_type.base_type)) {
      std::string result = field_name + ": " + TypeOf(field_type, imports);
      if (field->IsOptional()) result += " | None";
      return result;
    }

    switch (field_type.base_type) {
      case BASE_TYPE_STRUCT: {
        Import import =
            imports->Import(ModuleFor(field_type.struct_def),
                            namer_.ObjectType(*field_type.struct_def));
        return field_name + ": " + import.name + " | None";
      }
      case BASE_TYPE_STRING:
        return field_name + ": str | None";
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR: {
        imports->Import("typing");
        if (field_type.element == BASE_TYPE_STRUCT) {
          Import import =
              imports->Import(ModuleFor(field_type.struct_def),
                              namer_.ObjectType(*field_type.struct_def));
          return field_name + ": typing.List[" + import.name + "]";
        }
        if (field_type.element == BASE_TYPE_STRING) {
          return field_name + ": typing.List[str]";
        }
        return field_name + ": typing.List[" +
               TypeOf(field_type.VectorType(), imports) + "]";
      }
      case BASE_TYPE_UNION:
        return field_name + ": " +
               UnionObjectType(*field->value.type.enum_def, imports);
      default:
        return field_name;
    }
  }